

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O3

void Fra_SmlCheckOutputSavePattern(Fra_Man_t *p,Aig_Obj_t *pObjPo)

{
  int iVar1;
  Aig_Man_t *pAVar2;
  Aig_Man_t *pAVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  long lVar6;
  void *pvVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  Fra_Sml_t *pFVar13;
  
  iVar1 = p->pSml->nWordsTotal;
  lVar12 = (long)iVar1;
  if (0 < lVar12) {
    pFVar13 = p->pSml + 1;
    lVar6 = (long)(*(int *)(((ulong)pObjPo->pFanin0 & 0xfffffffffffffffe) + 0x24) * iVar1);
    lVar8 = lVar12;
    do {
      if (*(int *)((long)&pFVar13->pAig + lVar6 * 4) != 0) {
        uVar10 = 0;
        while ((*(uint *)((long)&pFVar13->pAig + lVar6 * 4) >> (uVar10 & 0x1f) & 1) == 0) {
          uVar10 = uVar10 + 1;
          if (uVar10 == 0x20) {
            __assert_fail("k < 32",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSim.c"
                          ,0x129,"void Fra_SmlCheckOutputSavePattern(Fra_Man_t *, Aig_Obj_t *)");
          }
        }
        pAVar2 = p->pManFraig;
        pvVar7 = malloc((long)pAVar2->nObjs[2] * 4 + 4);
        pAVar3 = p->pManAig;
        pVVar4 = pAVar3->vCis;
        uVar9 = (ulong)pVVar4->nSize;
        if (0 < (long)uVar9) {
          ppvVar5 = pVVar4->pArray;
          uVar11 = 0;
          do {
            *(uint *)((long)pvVar7 + uVar11 * 4) =
                 (uint)((*(uint *)((long)&pFVar13->pAig +
                                  *(int *)((long)ppvVar5[uVar11] + 0x24) * lVar12 * 4) >>
                         (uVar10 & 0x1f) & 1) != 0);
            uVar11 = uVar11 + 1;
          } while (uVar11 < uVar9);
        }
        *(int *)((long)pvVar7 + (long)pAVar3->nObjs[2] * 4) = pObjPo->Id;
        if (pAVar2->pData == (void *)0x0) {
          pAVar2->pData = pvVar7;
          return;
        }
        __assert_fail("p->pManFraig->pData == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSim.c"
                      ,0x136,"void Fra_SmlCheckOutputSavePattern(Fra_Man_t *, Aig_Obj_t *)");
      }
      pFVar13 = (Fra_Sml_t *)((long)&pFVar13->pAig + 4);
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
  }
  __assert_fail("i < p->pSml->nWordsTotal",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSim.c"
                ,0x124,"void Fra_SmlCheckOutputSavePattern(Fra_Man_t *, Aig_Obj_t *)");
}

Assistant:

void Fra_SmlCheckOutputSavePattern( Fra_Man_t * p, Aig_Obj_t * pObjPo )
{ 
    Aig_Obj_t * pFanin, * pObjPi;
    unsigned * pSims;
    int i, k, BestPat, * pModel;
    // find the word of the pattern
    pFanin = Aig_ObjFanin0(pObjPo);
    pSims = Fra_ObjSim(p->pSml, pFanin->Id);
    for ( i = 0; i < p->pSml->nWordsTotal; i++ )
        if ( pSims[i] )
            break;
    assert( i < p->pSml->nWordsTotal );
    // find the bit of the pattern
    for ( k = 0; k < 32; k++ )
        if ( pSims[i] & (1 << k) )
            break;
    assert( k < 32 );
    // determine the best pattern
    BestPat = i * 32 + k;
    // fill in the counter-example data
    pModel = ABC_ALLOC( int, Aig_ManCiNum(p->pManFraig)+1 );
    Aig_ManForEachCi( p->pManAig, pObjPi, i )
    {
        pModel[i] = Abc_InfoHasBit(Fra_ObjSim(p->pSml, pObjPi->Id), BestPat);
//        printf( "%d", pModel[i] );
    }
    pModel[Aig_ManCiNum(p->pManAig)] = pObjPo->Id;
//    printf( "\n" );
    // set the model
    assert( p->pManFraig->pData == NULL );
    p->pManFraig->pData = pModel;
    return;
}